

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

int setrbf(match *res,rbitfield *bf,easm_expr *expr)

{
  int iVar1;
  uint uVar2;
  ulong num_00;
  ull uVar3;
  ull totalsz;
  ull mask;
  ull num;
  easm_expr *expr_local;
  rbitfield *bf_local;
  match *res_local;
  
  iVar1 = easm_isimm(expr);
  if (iVar1 == 0) {
    res_local._4_4_ = 0;
  }
  else if ((expr->type == EASM_EXPR_NUM) && (bf->pcrel == 0)) {
    num_00 = expr->num - bf->addend >> ((byte)bf->shr & 0x3f);
    setsbf(res,bf->sbf[0].pos,bf->sbf[0].len,num_00);
    setsbf(res,bf->sbf[1].pos,bf->sbf[1].len,num_00 >> ((byte)bf->sbf[0].len & 0x3f));
    totalsz = 0xffffffffffffffff;
    uVar2 = bf->shr + bf->sbf[0].len + bf->sbf[1].len;
    if ((bf->wrapok != 0) && (uVar2 < 0x40)) {
      totalsz = (1L << ((byte)uVar2 & 0x3f)) - 1;
    }
    uVar3 = getrbf_as(bf,res->a,res->m,0);
    res_local._4_4_ = (uint)((uVar3 & totalsz) == (expr->num & totalsz));
  }
  else {
    if (res->nrelocs == 8) {
      __assert_fail("res->nrelocs != 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/envydis/core-as.c"
                    ,0xc4,"int setrbf(struct match *, const struct rbitfield *, struct easm_expr *)"
                   );
    }
    res->relocs[res->nrelocs].bf = bf;
    res->relocs[res->nrelocs].expr = expr;
    res->nrelocs = res->nrelocs + 1;
    res_local._4_4_ = 1;
  }
  return res_local._4_4_;
}

Assistant:

static int setrbf (struct match *res, const struct rbitfield *bf, struct easm_expr *expr) {
	if (!easm_isimm(expr))
		return 0;
	if (expr->type != EASM_EXPR_NUM || bf->pcrel) {
		assert (res->nrelocs != 8);
		res->relocs[res->nrelocs].bf = bf;
		res->relocs[res->nrelocs].expr = expr;
		res->nrelocs++;
		return 1;
	}
	ull num = expr->num - bf->addend;
	num >>= bf->shr;
	setsbf(res, bf->sbf[0].pos, bf->sbf[0].len, num);
	num >>= bf->sbf[0].len;
	setsbf(res, bf->sbf[1].pos, bf->sbf[1].len, num);
	ull mask = ~0ull;
	ull totalsz = bf->shr + bf->sbf[0].len + bf->sbf[1].len;
	if (bf->wrapok && totalsz < 64)
		mask = (1ull << totalsz) - 1;
	return (getrbf_as(bf, res->a, res->m, 0) & mask) == (expr->num & mask);
}